

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

result<double,_toml::error_info> *
toml::read_dec_float<double>
          (result<double,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src
          )

{
  double val;
  istringstream iss;
  value_type_conflict3 local_318;
  string local_310;
  string local_2f0;
  error_info local_2d0;
  source_location local_278;
  long local_200 [4];
  byte abStack_1e0 [88];
  ios_base local_188 [264];
  failure<toml::error_info> local_80;
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_200,(string *)str,_S_in);
  std::istream::_M_extract<double>((double *)local_200);
  if ((abStack_1e0[*(long *)(local_200[0] + -0x18)] & 5) == 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = local_318;
  }
  else {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,
               "toml::parse_floating: failed to read floating point value from stream","");
    source_location::source_location(&local_278,src);
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"here","");
    make_error_info<>(&local_2d0,&local_2f0,&local_278,&local_310);
    err<toml::error_info>(&local_80,&local_2d0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_80);
    failure<toml::error_info>::~failure(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.suffix_._M_dataplus._M_p != &local_2d0.suffix_.field_2) {
      operator_delete(local_2d0.suffix_._M_dataplus._M_p,
                      local_2d0.suffix_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2d0.locations_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.title_._M_dataplus._M_p != &local_2d0.title_.field_2) {
      operator_delete(local_2d0.title_._M_dataplus._M_p,
                      local_2d0.title_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_200);
  std::ios_base::~ios_base(local_188);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_dec_float(const std::string& str, const source_location src)
{
    T val;
    std::istringstream iss(str);
    iss >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_floating: "
            "failed to read floating point value from stream",
            std::move(src), "here"));
    }
    return ok(val);
}